

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  ostream *poVar1;
  size_t sVar2;
  size_type sVar3;
  VarValue *value;
  int iVar4;
  char *pcVar5;
  pointer pcVar6;
  bool bVar7;
  string local_38;
  
  if (uniform->type - TYPE_SAMPLER_1D < 0x1e) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"compare_vec4(",0xd);
    bVar7 = uniform->type != TYPE_SAMPLER_2D;
    pcVar5 = "textureCube";
    if (!bVar7) {
      pcVar5 = "texture2D";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,pcVar5,(ulong)bVar7 * 2 + 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"(",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)dst,(uniform->name)._M_dataplus._M_p,
                        (uniform->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", vec",5);
    iVar4 = 2;
    if (uniform->type != TYPE_SAMPLER_2D) {
      iVar4 = (uint)(uniform->type == TYPE_SAMPLER_CUBE) * 3;
    }
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
    pcVar6 = "(0.0))";
    sVar3 = 6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"compare_",8);
    pcVar5 = glu::getDataTypeName(uniform->type);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)dst + (int)*(undefined8 *)(*(long *)dst + -0x18));
    }
    else {
      sVar2 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,pcVar5,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"(",1);
    pcVar6 = (uniform->name)._M_dataplus._M_p;
    sVar3 = (uniform->name)._M_string_length;
    poVar1 = (ostream *)dst;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,", ",2);
  shaderVarValueStr_abi_cxx11_(&local_38,(Functional *)&uniform->finalValue,value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)dst,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
	{
		dst << "compare_vec4("
			<< (uniform.type == glu::TYPE_SAMPLER_2D ? "texture2D" : "textureCube")
			<< "(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	}
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}